

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mvs.c
# Opt level: O3

void simulate_unbind(FX2 *frame,int unbind_count,FX2 *returner)

{
  uint uVar1;
  ulong uVar2;
  int iVar3;
  long lVar4;
  
  if (0 < unbind_count) {
    lVar4 = (ulong)((uint)frame->nextblock * 2) + (long)Stackspace;
    iVar3 = 0;
    do {
      do {
        uVar1 = *(uint *)(lVar4 + -4);
        lVar4 = lVar4 + -4;
      } while (-1 < (int)uVar1);
      if (uVar1 < 0xffff0000) {
        uVar2 = (ulong)((~uVar1 >> 0x10) - 1);
        memset((void *)((long)frame + (ulong)(uVar1 & 0xffff) * 2 + uVar2 * -4 + 0x14),0xff,
               uVar2 * 4 + 4);
      }
      iVar3 = iVar3 + 1;
    } while (iVar3 != unbind_count);
  }
  if (returner != (FX2 *)0x0) {
    returner->field_0x3 = returner->field_0x3 & 0xef;
  }
  return;
}

Assistant:

void simulate_unbind(FX2 *frame, int unbind_count, FX2 *returner) {
  int unbind;
  LispPTR *stackptr = (LispPTR *)(Stackspace + frame->nextblock);
  for (unbind = 0; unbind < unbind_count; unbind++) {
    int value;
    LispPTR *lastpvar;
    int bindnvalues;
    for (; ((int)*--stackptr >= 0);)
      ; /* find the binding mark */
    value = (int)*stackptr;
    lastpvar = (LispPTR *)((DLword *)frame + FRAMESIZE + 2 + GetLoWord(value));
    bindnvalues = (~value) >> 16;
    for (value = bindnvalues; --value >= 0;) { *--lastpvar = 0xffffffff; }
    /* This line caused \NSMAIL.READ.HEADING to smash memory, */
    /* so I removed it 21 Jul 91 --JDS.  This was the only	  */
    /* difference between this function and the UNWIND code   */
    /* in inlineC.h						  */
    /*	MAKEFREEBLOCK(stackptr, (DLword *)stackptr-nextblock); */
  }
  if (returner)
    returner->fast = 0; /* since we've destroyed contiguity */
                        /* in the stack, but that only
                           matters if there's a return. */
}